

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3BtreeInsert(BtCursor *pCur,BtreePayload *pX,int flags,int seekResult)

{
  byte bVar1;
  ushort uVar2;
  Btree *pBtree;
  long lVar3;
  MemPage *pMVar4;
  u8 *puVar5;
  Pgno parent;
  Pgno PVar6;
  BtreePayload *pBVar7;
  BtCursor *pCur_00;
  BtShared *pBt;
  int iVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  KeyInfo *pKVar13;
  uint uVar14;
  uint uVar15;
  u64 v;
  u8 *__dest;
  uchar *pCell;
  void *pvVar16;
  int loc;
  int rc;
  BtreePayload x2;
  int local_c0;
  uint local_bc;
  int local_b8;
  Pgno local_b4;
  u8 *local_b0;
  KeyInfo *local_a8;
  int local_9c;
  MemPage *local_98;
  int local_8c;
  BtreePayload *local_88;
  BtCursor *local_80;
  uint *local_78;
  BtShared *local_70;
  BtShared *local_68;
  BtreePayload local_60;
  
  if (pCur->eState == '\x04') {
    return pCur->skipNext;
  }
  pBtree = pCur->pBtree;
  local_68 = pBtree->pBt;
  local_b8 = seekResult;
  if (((pCur->curFlags & 0x20) != 0) &&
     (iVar8 = saveAllCursors(local_68,pCur->pgnoRoot,pCur), iVar8 != 0)) {
    return iVar8;
  }
  if (pCur->pKeyInfo == (KeyInfo *)0x0) {
    invalidateIncrblobCursors(pBtree,pCur->pgnoRoot,pX->nKey,0);
    if (((pCur->curFlags & 2) == 0) || (pX->nKey != (pCur->info).nKey)) {
      if ((seekResult == 0) &&
         (iVar8 = sqlite3BtreeMovetoUnpacked
                            (pCur,(UnpackedRecord *)0x0,pX->nKey,(uint)(flags != 0),&local_b8),
         iVar8 != 0)) {
        return iVar8;
      }
    }
    else if (((pCur->info).nSize != 0) && ((pCur->info).nPayload == pX->nZero + pX->nData)) {
      iVar8 = btreeOverwriteCell(pCur,pX);
      return iVar8;
    }
  }
  else {
    if ((flags & 2U) == 0 && seekResult == 0) {
      if (pX->nMem == 0) {
        iVar8 = btreeMoveto(pCur,pX->pKey,pX->nKey,(uint)(flags != 0),&local_b8);
      }
      else {
        local_60.nKey = (sqlite3_int64)pX->aMem;
        local_60.pData._0_7_ = (uint7)pX->nMem;
        local_60.pKey = pCur->pKeyInfo;
        iVar8 = sqlite3BtreeMovetoUnpacked
                          (pCur,(UnpackedRecord *)&local_60,0,(uint)(flags != 0),&local_b8);
      }
      if (iVar8 != 0) {
        return iVar8;
      }
      local_c0 = 0;
      seekResult = local_b8;
    }
    if (seekResult == 0) {
      getCellInfo(pCur);
      lVar3 = (pCur->info).nKey;
      if (lVar3 == pX->nKey) {
        local_60.pData = pX->pKey;
        local_60.nData = (int)lVar3;
        local_60.nZero = 0;
        iVar8 = btreeOverwriteCell(pCur,&local_60);
        return iVar8;
      }
    }
  }
  pMVar4 = pCur->pPage;
  if (pMVar4->nFree < 0) {
    iVar8 = btreeComputeFreeSpace(pMVar4);
    if (iVar8 != 0) {
      return iVar8;
    }
    local_c0 = 0;
  }
  puVar5 = local_68->pTmpSpace;
  bVar1 = pMVar4->childPtrSize;
  local_b0 = puVar5;
  local_9c = flags;
  local_88 = pX;
  local_80 = pCur;
  if (pMVar4->intKey == '\0') {
    pvVar16 = pX->pKey;
    uVar11 = pX->nKey;
    if ((uint)uVar11 < 0x80) {
      puVar5[bVar1] = (u8)uVar11;
      uVar14 = 1;
    }
    else {
      uVar14 = sqlite3PutVarint(puVar5 + bVar1,(long)(int)(uint)uVar11);
      uVar14 = uVar14 & 0xff;
    }
    iVar8 = uVar14 + bVar1;
    v = uVar11 & 0xffffffff;
  }
  else {
    uVar11 = (ulong)pX->nData;
    v = (long)pX->nZero + uVar11;
    pvVar16 = pX->pData;
    if ((uint)v < 0x80) {
      puVar5[bVar1] = (u8)v;
      uVar14 = 1;
    }
    else {
      uVar14 = sqlite3PutVarint(puVar5 + bVar1,v);
      uVar14 = uVar14 & 0xff;
    }
    iVar8 = sqlite3PutVarint(puVar5 + (uVar14 + bVar1),local_88->nKey);
    iVar8 = iVar8 + uVar14 + bVar1;
  }
  __dest = puVar5 + iVar8;
  iVar9 = (int)v;
  local_98 = pMVar4;
  if ((int)(uint)pMVar4->maxLocal < iVar9) {
    uVar2 = pMVar4->minLocal;
    local_70 = pMVar4->pBt;
    local_a8 = (KeyInfo *)0x0;
    uVar14 = (iVar9 - (uint)uVar2) % (local_70->usableSize - 4) + (uint)uVar2;
    if ((int)(uint)pMVar4->maxLocal < (int)uVar14) {
      uVar14 = (uint)uVar2;
    }
    local_bc = iVar8 + uVar14 + 4;
    local_78 = (uint *)(puVar5 + (int)(uVar14 + iVar8));
    local_b4 = 0;
    while( true ) {
      uVar15 = (uint)v;
      uVar12 = uVar14;
      if ((int)uVar15 < (int)uVar14) {
        uVar12 = uVar15;
      }
      uVar10 = (uint)uVar11;
      if ((int)uVar10 < (int)uVar12) {
        if ((int)uVar10 < 1) {
          memset(__dest,0,(long)(int)uVar12);
        }
        else {
          memcpy(__dest,pvVar16,uVar11 & 0xffffffff);
          uVar12 = uVar10;
        }
      }
      else {
        memcpy(__dest,pvVar16,(long)(int)uVar12);
      }
      pBt = local_70;
      parent = local_b4;
      v = (u64)(uVar15 - uVar12);
      if (uVar15 - uVar12 == 0 || (int)uVar15 < (int)uVar12) break;
      __dest = __dest + (int)uVar12;
      pvVar16 = (void *)((long)pvVar16 + (long)(int)uVar12);
      uVar11 = (ulong)(uVar10 - uVar12);
      uVar14 = uVar14 - uVar12;
      if (uVar14 == 0) {
        local_60.pKey = (KeyInfo *)0x0;
        if (local_70->autoVacuum != '\0') {
          do {
            uVar12 = local_b4;
            local_b4 = uVar12 + 1;
            uVar14 = 0;
            if (1 < local_b4) {
              iVar8 = (uVar12 - 1) - (uVar12 - 1) % (local_70->usableSize / 5 + 1);
              uVar14 = iVar8 + (uint)(iVar8 + 1U == (uint)sqlite3PendingByte / local_70->pageSize) +
                       2;
            }
          } while ((local_b4 == uVar14) || (uVar12 == (uint)sqlite3PendingByte / local_70->pageSize)
                  );
          local_b4 = uVar12 + 1;
        }
        iVar8 = allocateBtreePage(local_70,(MemPage **)&local_60,&local_b4,local_b4,'\0');
        PVar6 = local_b4;
        local_8c = iVar8;
        if ((pBt->autoVacuum == '\0') || (iVar8 != 0)) {
          pKVar13 = local_a8;
          if (iVar8 != 0) goto LAB_001748f8;
        }
        else {
          ptrmapPut(pBt,local_b4,'\x04' - (parent == 0),parent,&local_8c);
          iVar8 = local_8c;
          pKVar13 = local_a8;
          if (local_8c != 0) {
            if ((KeyInfo *)local_60.pKey != (KeyInfo *)0x0) {
              sqlite3PagerUnrefNotNull
                        ((DbPage *)((KeyInfo *)((long)local_60.pKey + 0x50))->aColl[0]);
            }
LAB_001748f8:
            if (pKVar13 == (KeyInfo *)0x0) {
              return iVar8;
            }
            sqlite3PagerUnrefNotNull((DbPage *)pKVar13[2].aColl[0]);
            return iVar8;
          }
        }
        *local_78 = PVar6 >> 0x18 | (PVar6 & 0xff0000) >> 8 | (PVar6 & 0xff00) << 8 | PVar6 << 0x18;
        if (local_a8 != (KeyInfo *)0x0) {
          sqlite3PagerUnrefNotNull((DbPage *)local_a8[2].aColl[0]);
        }
        local_a8 = (KeyInfo *)local_60.pKey;
        local_78 = *(uint **)((long)local_60.pKey + 0x50);
        *local_78 = 0;
        __dest = (u8 *)(*(long *)((long)local_60.pKey + 0x50) + 4);
        uVar14 = local_70->usableSize - 4;
      }
    }
    if (local_a8 != (KeyInfo *)0x0) {
      sqlite3PagerUnrefNotNull((DbPage *)local_a8[2].aColl[0]);
    }
  }
  else {
    local_bc = 4;
    if (4 < iVar8 + iVar9) {
      local_bc = iVar8 + iVar9;
    }
    iVar8 = (int)uVar11;
    memcpy(__dest,pvVar16,(long)iVar8);
    memset(__dest + iVar8,0,(long)(iVar9 - iVar8));
  }
  pCur_00 = local_80;
  pMVar4 = local_98;
  iVar8 = local_9c;
  local_c0 = 0;
  uVar2 = local_80->ix;
  uVar14 = (uint)uVar2;
  if (local_b8 == 0) {
    iVar9 = sqlite3PagerWrite(local_98->pDbPage);
    if (iVar9 != 0) {
      return iVar9;
    }
    pCell = pMVar4->aData +
            (CONCAT11(pMVar4->aCellIdx[(ulong)uVar2 * 2],pMVar4->aCellIdx[(ulong)uVar2 * 2 + 1]) &
            pMVar4->maskPage);
    if (pMVar4->leaf == '\0') {
      *(undefined4 *)local_b0 = *(undefined4 *)pCell;
    }
    local_c0 = clearCell(pMVar4,pCell,(CellInfo *)&local_60);
    if (local_bc == local_60.pData._6_2_) {
      if (((uint)local_60.pData == local_60.pData._4_2_) &&
         ((local_68->autoVacuum == '\0' || (local_bc < local_98->minLocal)))) {
        if (local_98->aDataEnd < pCell + local_bc) {
          sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x11931,
                      "fc82b73eaac8b36950e527f12c4b5dc1e147e6f4ad2217ae43ad82882a88bfa6");
          return 0xb;
        }
        memcpy(pCell,local_b0,(ulong)local_bc);
        return 0;
      }
    }
    dropCell(local_98,(uint)uVar2,(uint)local_60.pData._6_2_,&local_c0);
    if (local_c0 != 0) {
      return local_c0;
    }
  }
  else if ((local_b8 < 0) && (local_98->nCell != 0)) {
    local_80->ix = uVar2 + 1;
    uVar14 = (uint)(ushort)(uVar2 + 1);
    local_80->curFlags = local_80->curFlags & 0xfd;
  }
  pMVar4 = local_98;
  insertCell(local_98,uVar14,local_b0,local_bc,(u8 *)0x0,0,&local_c0);
  (pCur_00->info).nSize = 0;
  iVar9 = local_c0;
  if (pMVar4->nOverflow != '\0') {
    pCur_00->curFlags = pCur_00->curFlags & 0xfd;
    iVar9 = balance(pCur_00);
    pCur_00->pPage->nOverflow = '\0';
    pCur_00->eState = '\x01';
    if ((iVar9 == 0 & (byte)iVar8 >> 1) == 1) {
      btreeReleaseAllCursorPages(pCur_00);
      pBVar7 = local_88;
      iVar9 = 0;
      if (pCur_00->pKeyInfo != (KeyInfo *)0x0) {
        pvVar16 = sqlite3Malloc(local_88->nKey);
        pCur_00->pKey = pvVar16;
        if (pvVar16 == (void *)0x0) {
          iVar9 = 7;
        }
        else {
          memcpy(pvVar16,pBVar7->pKey,pBVar7->nKey);
        }
      }
      pCur_00->eState = '\x03';
      pCur_00->nKey = pBVar7->nKey;
    }
  }
  return iVar9;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeInsert(
  BtCursor *pCur,                /* Insert data into the table of this cursor */
  const BtreePayload *pX,        /* Content of the row to be inserted */
  int flags,                     /* True if this is likely an append */
  int seekResult                 /* Result of prior MovetoUnpacked() call */
){
  int rc;
  int loc = seekResult;          /* -1: before desired location  +1: after */
  int szNew = 0;
  int idx;
  MemPage *pPage;
  Btree *p = pCur->pBtree;
  BtShared *pBt = p->pBt;
  unsigned char *oldCell;
  unsigned char *newCell = 0;

  assert( (flags & (BTREE_SAVEPOSITION|BTREE_APPEND))==flags );

  if( pCur->eState==CURSOR_FAULT ){
    assert( pCur->skipNext!=SQLITE_OK );
    return pCur->skipNext;
  }

  assert( cursorOwnsBtShared(pCur) );
  assert( (pCur->curFlags & BTCF_WriteFlag)!=0
              && pBt->inTransaction==TRANS_WRITE
              && (pBt->btsFlags & BTS_READ_ONLY)==0 );
  assert( hasSharedCacheTableLock(p, pCur->pgnoRoot, pCur->pKeyInfo!=0, 2) );

  /* Assert that the caller has been consistent. If this cursor was opened
  ** expecting an index b-tree, then the caller should be inserting blob
  ** keys with no associated data. If the cursor was opened expecting an
  ** intkey table, the caller should be inserting integer keys with a
  ** blob of associated data.  */
  assert( (pX->pKey==0)==(pCur->pKeyInfo==0) );

  /* Save the positions of any other cursors open on this table.
  **
  ** In some cases, the call to btreeMoveto() below is a no-op. For
  ** example, when inserting data into a table with auto-generated integer
  ** keys, the VDBE layer invokes sqlite3BtreeLast() to figure out the 
  ** integer key to use. It then calls this function to actually insert the 
  ** data into the intkey B-Tree. In this case btreeMoveto() recognizes
  ** that the cursor is already where it needs to be and returns without
  ** doing any work. To avoid thwarting these optimizations, it is important
  ** not to clear the cursor here.
  */
  if( pCur->curFlags & BTCF_Multiple ){
    rc = saveAllCursors(pBt, pCur->pgnoRoot, pCur);
    if( rc ) return rc;
  }

  if( pCur->pKeyInfo==0 ){
    assert( pX->pKey==0 );
    /* If this is an insert into a table b-tree, invalidate any incrblob 
    ** cursors open on the row being replaced */
    invalidateIncrblobCursors(p, pCur->pgnoRoot, pX->nKey, 0);

    /* If BTREE_SAVEPOSITION is set, the cursor must already be pointing 
    ** to a row with the same key as the new entry being inserted.
    */
#ifdef SQLITE_DEBUG
    if( flags & BTREE_SAVEPOSITION ){
      assert( pCur->curFlags & BTCF_ValidNKey );
      assert( pX->nKey==pCur->info.nKey );
      assert( pCur->info.nSize!=0 );
      assert( loc==0 );
    }
#endif

    /* On the other hand, BTREE_SAVEPOSITION==0 does not imply
    ** that the cursor is not pointing to a row to be overwritten.
    ** So do a complete check.
    */
    if( (pCur->curFlags&BTCF_ValidNKey)!=0 && pX->nKey==pCur->info.nKey ){
      /* The cursor is pointing to the entry that is to be
      ** overwritten */
      assert( pX->nData>=0 && pX->nZero>=0 );
      if( pCur->info.nSize!=0
       && pCur->info.nPayload==(u32)pX->nData+pX->nZero
      ){
        /* New entry is the same size as the old.  Do an overwrite */
        return btreeOverwriteCell(pCur, pX);
      }
      assert( loc==0 );
    }else if( loc==0 ){
      /* The cursor is *not* pointing to the cell to be overwritten, nor
      ** to an adjacent cell.  Move the cursor so that it is pointing either
      ** to the cell to be overwritten or an adjacent cell.
      */
      rc = sqlite3BtreeMovetoUnpacked(pCur, 0, pX->nKey, flags!=0, &loc);
      if( rc ) return rc;
    }
  }else{
    /* This is an index or a WITHOUT ROWID table */

    /* If BTREE_SAVEPOSITION is set, the cursor must already be pointing 
    ** to a row with the same key as the new entry being inserted.
    */
    assert( (flags & BTREE_SAVEPOSITION)==0 || loc==0 );

    /* If the cursor is not already pointing either to the cell to be
    ** overwritten, or if a new cell is being inserted, if the cursor is
    ** not pointing to an immediately adjacent cell, then move the cursor
    ** so that it does.
    */
    if( loc==0 && (flags & BTREE_SAVEPOSITION)==0 ){
      if( pX->nMem ){
        UnpackedRecord r;
        r.pKeyInfo = pCur->pKeyInfo;
        r.aMem = pX->aMem;
        r.nField = pX->nMem;
        r.default_rc = 0;
        r.errCode = 0;
        r.r1 = 0;
        r.r2 = 0;
        r.eqSeen = 0;
        rc = sqlite3BtreeMovetoUnpacked(pCur, &r, 0, flags!=0, &loc);
      }else{
        rc = btreeMoveto(pCur, pX->pKey, pX->nKey, flags!=0, &loc);
      }
      if( rc ) return rc;
    }

    /* If the cursor is currently pointing to an entry to be overwritten
    ** and the new content is the same as as the old, then use the
    ** overwrite optimization.
    */
    if( loc==0 ){
      getCellInfo(pCur);
      if( pCur->info.nKey==pX->nKey ){
        BtreePayload x2;
        x2.pData = pX->pKey;
        x2.nData = pX->nKey;
        x2.nZero = 0;
        return btreeOverwriteCell(pCur, &x2);
      }
    }

  }
  assert( pCur->eState==CURSOR_VALID || (pCur->eState==CURSOR_INVALID && loc) );

  pPage = pCur->pPage;
  assert( pPage->intKey || pX->nKey>=0 );
  assert( pPage->leaf || !pPage->intKey );
  if( pPage->nFree<0 ){
    rc = btreeComputeFreeSpace(pPage);
    if( rc ) return rc;
  }

  TRACE(("INSERT: table=%d nkey=%lld ndata=%d page=%d %s\n",
          pCur->pgnoRoot, pX->nKey, pX->nData, pPage->pgno,
          loc==0 ? "overwrite" : "new entry"));
  assert( pPage->isInit );
  newCell = pBt->pTmpSpace;
  assert( newCell!=0 );
  rc = fillInCell(pPage, newCell, pX, &szNew);
  if( rc ) goto end_insert;
  assert( szNew==pPage->xCellSize(pPage, newCell) );
  assert( szNew <= MX_CELL_SIZE(pBt) );
  idx = pCur->ix;
  if( loc==0 ){
    CellInfo info;
    assert( idx<pPage->nCell );
    rc = sqlite3PagerWrite(pPage->pDbPage);
    if( rc ){
      goto end_insert;
    }
    oldCell = findCell(pPage, idx);
    if( !pPage->leaf ){
      memcpy(newCell, oldCell, 4);
    }
    rc = clearCell(pPage, oldCell, &info);
    if( info.nSize==szNew && info.nLocal==info.nPayload 
     && (!ISAUTOVACUUM || szNew<pPage->minLocal)
    ){
      /* Overwrite the old cell with the new if they are the same size.
      ** We could also try to do this if the old cell is smaller, then add
      ** the leftover space to the free list.  But experiments show that
      ** doing that is no faster then skipping this optimization and just
      ** calling dropCell() and insertCell(). 
      **
      ** This optimization cannot be used on an autovacuum database if the
      ** new entry uses overflow pages, as the insertCell() call below is
      ** necessary to add the PTRMAP_OVERFLOW1 pointer-map entry.  */
      assert( rc==SQLITE_OK ); /* clearCell never fails when nLocal==nPayload */
      if( oldCell+szNew > pPage->aDataEnd ) return SQLITE_CORRUPT_BKPT;
      memcpy(oldCell, newCell, szNew);
      return SQLITE_OK;
    }
    dropCell(pPage, idx, info.nSize, &rc);
    if( rc ) goto end_insert;
  }else if( loc<0 && pPage->nCell>0 ){
    assert( pPage->leaf );
    idx = ++pCur->ix;
    pCur->curFlags &= ~BTCF_ValidNKey;
  }else{
    assert( pPage->leaf );
  }
  insertCell(pPage, idx, newCell, szNew, 0, 0, &rc);
  assert( pPage->nOverflow==0 || rc==SQLITE_OK );
  assert( rc!=SQLITE_OK || pPage->nCell>0 || pPage->nOverflow>0 );

  /* If no error has occurred and pPage has an overflow cell, call balance() 
  ** to redistribute the cells within the tree. Since balance() may move
  ** the cursor, zero the BtCursor.info.nSize and BTCF_ValidNKey
  ** variables.
  **
  ** Previous versions of SQLite called moveToRoot() to move the cursor
  ** back to the root page as balance() used to invalidate the contents
  ** of BtCursor.apPage[] and BtCursor.aiIdx[]. Instead of doing that,
  ** set the cursor state to "invalid". This makes common insert operations
  ** slightly faster.
  **
  ** There is a subtle but important optimization here too. When inserting
  ** multiple records into an intkey b-tree using a single cursor (as can
  ** happen while processing an "INSERT INTO ... SELECT" statement), it
  ** is advantageous to leave the cursor pointing to the last entry in
  ** the b-tree if possible. If the cursor is left pointing to the last
  ** entry in the table, and the next row inserted has an integer key
  ** larger than the largest existing key, it is possible to insert the
  ** row without seeking the cursor. This can be a big performance boost.
  */
  pCur->info.nSize = 0;
  if( pPage->nOverflow ){
    assert( rc==SQLITE_OK );
    pCur->curFlags &= ~(BTCF_ValidNKey);
    rc = balance(pCur);

    /* Must make sure nOverflow is reset to zero even if the balance()
    ** fails. Internal data structure corruption will result otherwise. 
    ** Also, set the cursor state to invalid. This stops saveCursorPosition()
    ** from trying to save the current position of the cursor.  */
    pCur->pPage->nOverflow = 0;
    pCur->eState = CURSOR_INVALID;
    if( (flags & BTREE_SAVEPOSITION) && rc==SQLITE_OK ){
      btreeReleaseAllCursorPages(pCur);
      if( pCur->pKeyInfo ){
        assert( pCur->pKey==0 );
        pCur->pKey = sqlite3Malloc( pX->nKey );
        if( pCur->pKey==0 ){
          rc = SQLITE_NOMEM;
        }else{
          memcpy(pCur->pKey, pX->pKey, pX->nKey);
        }
      }
      pCur->eState = CURSOR_REQUIRESEEK;
      pCur->nKey = pX->nKey;
    }
  }
  assert( pCur->iPage<0 || pCur->pPage->nOverflow==0 );

end_insert:
  return rc;
}